

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Supp_One_t * Supp_ManMergeEntry(Supp_Man_t *pMan,Supp_One_t *p1,Supp_One_t *p2,int nRefs)

{
  int iVar1;
  int iVar2;
  Supp_One_t *pSVar3;
  int *pEnd2;
  int *pEnd1;
  int *pBeg;
  int *pBeg2;
  int *pBeg1;
  Supp_One_t *p;
  int nRefs_local;
  Supp_One_t *p2_local;
  Supp_One_t *p1_local;
  Supp_Man_t *pMan_local;
  
  pSVar3 = Supp_ManFetchEntry(pMan,p1->nOuts + p2->nOuts,nRefs);
  pBeg2 = &p1[1].nRefs;
  pBeg = &p2[1].nRefs;
  pEnd1 = &pSVar3[1].nRefs;
  iVar1 = p1->nOuts;
  iVar2 = p2->nOuts;
  while (pBeg2 < &p1[1].nRefs + iVar1 && pBeg < &p2[1].nRefs + iVar2) {
    if (*pBeg2 == *pBeg) {
      *pEnd1 = *pBeg2;
      pBeg = pBeg + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pBeg) {
      *pEnd1 = *pBeg2;
      pBeg2 = pBeg2 + 1;
    }
    else {
      *pEnd1 = *pBeg;
      pBeg = pBeg + 1;
    }
    pEnd1 = pEnd1 + 1;
  }
  while (pBeg2 < &p1[1].nRefs + iVar1) {
    *pEnd1 = *pBeg2;
    pEnd1 = pEnd1 + 1;
    pBeg2 = pBeg2 + 1;
  }
  while (pBeg < &p2[1].nRefs + iVar2) {
    *pEnd1 = *pBeg;
    pEnd1 = pEnd1 + 1;
    pBeg = pBeg + 1;
  }
  pSVar3->nOuts = (int)((long)pEnd1 - (long)(pSVar3 + 1) >> 2);
  if (pSVar3->nOutsAlloc < pSVar3->nOuts) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0xea,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (pSVar3->nOuts < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0xeb,
                  "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
  }
  if (p2->nOuts <= pSVar3->nOuts) {
    return pSVar3;
  }
  __assert_fail("p->nOuts >= p2->nOuts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                ,0xec,
                "Supp_One_t *Supp_ManMergeEntry(Supp_Man_t *, Supp_One_t *, Supp_One_t *, int)");
}

Assistant:

Supp_One_t * Supp_ManMergeEntry( Supp_Man_t * pMan, Supp_One_t * p1, Supp_One_t * p2, int nRefs )
{
    Supp_One_t * p = Supp_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}